

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void expr_discharge(Parser *psr,Node *node)

{
  VM *vm;
  int iVar1;
  
  if (node->type == NODE_LOCAL) {
    node->type = NODE_NON_RELOC;
  }
  else if (node->type == NODE_NUM) {
    vm = psr->vm;
    if (0xfffe < vm->consts_count) {
      psr_trigger_err(psr,"too many constants");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x235,"void expr_discharge(Parser *, Node *)");
    }
    node->type = NODE_CONST;
    iVar1 = vm_add_num(vm,(node->field_1).num);
    (node->field_1).const_idx = (uint16_t)iVar1;
  }
  return;
}

Assistant:

static void expr_discharge(Parser *psr, Node *node) {
	switch (node->type) {
	case NODE_NUM:
		// Check we don't exceed the maximum number of allowed constants
		if (psr->vm->consts_count >= MAX_CONSTS) {
			psr_trigger_err(psr, "too many constants");
			UNREACHABLE();
		}
		node->type = NODE_CONST;
		node->const_idx = (uint16_t) vm_add_num(psr->vm, node->num);
		break;

	case NODE_LOCAL:
		node->type = NODE_NON_RELOC;
		// Slot value remains the same
		break;

	default:
		// All other node types are already discharged
		break;
	}
}